

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlAddEncodingAlias(char *name,char *alias)

{
  __int32_t _Var1;
  xmlCharEncodingAliasPtr pxVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  char upper [100];
  char local_98 [104];
  
  iVar3 = -1;
  if (alias != (char *)0x0 && name != (char *)0x0) {
    uVar7 = 0;
    pp_Var4 = __ctype_toupper_loc();
    do {
      _Var1 = (*pp_Var4)[alias[uVar7]];
      local_98[uVar7] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_001438b2;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 99);
    uVar7 = 99;
LAB_001438b2:
    local_98[uVar7 & 0xffffffff] = '\0';
    if (xmlCharEncodingAliases == (xmlCharEncodingAliasPtr)0x0) {
      xmlCharEncodingAliasesNb = 0;
      xmlCharEncodingAliasesMax = 0x14;
      xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)(*xmlMalloc)(0x140);
      if (xmlCharEncodingAliases == (xmlCharEncodingAliasPtr)0x0) {
        return -1;
      }
    }
    else {
      lVar6 = (long)xmlCharEncodingAliasesMax;
      if (xmlCharEncodingAliasesMax <= xmlCharEncodingAliasesNb) {
        xmlCharEncodingAliasesMax = xmlCharEncodingAliasesMax * 2;
        xmlCharEncodingAliases =
             (xmlCharEncodingAliasPtr)(*xmlRealloc)(xmlCharEncodingAliases,lVar6 << 5);
      }
    }
    pxVar2 = xmlCharEncodingAliases;
    lVar6 = (long)xmlCharEncodingAliasesNb;
    if (0 < lVar6) {
      lVar8 = 0;
      do {
        iVar3 = strcmp(*(char **)((long)&pxVar2->alias + lVar8),local_98);
        if (iVar3 == 0) {
          (*xmlFree)(*(void **)((long)&pxVar2->name + lVar8));
          pcVar5 = (*xmlMemStrdup)(name);
          *(char **)((long)&xmlCharEncodingAliases->name + lVar8) = pcVar5;
          goto LAB_001439cc;
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar6 * 0x10 != lVar8);
    }
    pcVar5 = (*xmlMemStrdup)(name);
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = pcVar5;
    pcVar5 = (*xmlMemStrdup)(local_98);
    lVar6 = (long)xmlCharEncodingAliasesNb;
    xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + 1;
    xmlCharEncodingAliases[lVar6].alias = pcVar5;
LAB_001439cc:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
xmlAddEncodingAlias(const char *name, const char *alias) {
    int i;
    char upper[100];

    if ((name == NULL) || (alias == NULL))
	return(-1);

    for (i = 0;i < 99;i++) {
        upper[i] = toupper(alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (xmlCharEncodingAliases == NULL) {
	xmlCharEncodingAliasesNb = 0;
	xmlCharEncodingAliasesMax = 20;
	xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)
	      xmlMalloc(xmlCharEncodingAliasesMax * sizeof(xmlCharEncodingAlias));
	if (xmlCharEncodingAliases == NULL)
	    return(-1);
    } else if (xmlCharEncodingAliasesNb >= xmlCharEncodingAliasesMax) {
	xmlCharEncodingAliasesMax *= 2;
	xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)
	      xmlRealloc(xmlCharEncodingAliases,
		         xmlCharEncodingAliasesMax * sizeof(xmlCharEncodingAlias));
    }
    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    /*
	     * Replace the definition.
	     */
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlCharEncodingAliases[i].name = xmlMemStrdup(name);
	    return(0);
	}
    }
    /*
     * Add the definition
     */
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = xmlMemStrdup(name);
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = xmlMemStrdup(upper);
    xmlCharEncodingAliasesNb++;
    return(0);
}